

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar_open_list.hpp
# Opt level: O0

void __thiscall
external_astar::ExternalAstarOpenList<Node<Tiles>_>::ExternalAstarOpenList
          (ExternalAstarOpenList<Node<Tiles>_> *this)

{
  long in_RDI;
  
  std::
  map<int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
  ::map((map<int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
         *)0x11e21f);
  std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)(in_RDI + 0x30));
  *(undefined1 *)(in_RDI + 0x38) = 1;
  mkdir("open_list_buckets",0x1e4);
  dfpair(_stdout,"merge chunk (bytes)","%lu",MERGE_CHUNK_BYTES);
  return;
}

Assistant:

ExternalAstarOpenList<Entry>::ExternalAstarOpenList()
    {
        // create directory for open list files if not exist
        mkdir("open_list_buckets", 0744);
        dfpair(stdout, "merge chunk (bytes)", "%lu", MERGE_CHUNK_BYTES);
    }